

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall cs_impl::any::holder<cs::lang_error>::~holder(holder<cs::lang_error> *this)

{
  holder<cs::lang_error> *in_RDI;
  
  ~holder(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

~ holder() override = default;